

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Abc_NtkPrintFanoutProfileVec(Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *p;
  char *pcVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  uint local_24;
  int i;
  Abc_Obj_t *pFanout;
  Vec_Ptr_t *vFanouts_local;
  Abc_Obj_t *pObj_local;
  
  uVar1 = Vec_PtrSize(vFanouts);
  printf("Fanout profile (%d):\n",(ulong)uVar1);
  for (local_24 = 0; iVar2 = Vec_PtrSize(vFanouts), (int)local_24 < iVar2; local_24 = local_24 + 1)
  {
    p = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,local_24);
    fVar6 = Bus_SclObjETime(p);
    fVar7 = Bus_SclObjCin(p);
    printf("%3d : time = %7.2f ps   load = %7.2f ff  ",(double)fVar6,(double)fVar7,(ulong)local_24);
    if (pObj->pNtk->vPhases != (Vec_Int_t *)0x0) {
      bVar5 = false;
      if (pObj != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_ObjFanoutNum(pObj);
        iVar3 = Vec_PtrSize(vFanouts);
        bVar5 = false;
        if (iVar2 == iVar3) {
          iVar2 = Abc_NodeFindFanin(p,pObj);
          iVar2 = Abc_ObjFaninPhase(p,iVar2);
          bVar5 = iVar2 != 0;
        }
      }
      pcVar4 = " ";
      if (bVar5) {
        pcVar4 = "*";
      }
      printf("%s",pcVar4);
    }
    printf("\n");
  }
  printf("\n");
  return;
}

Assistant:

void Abc_NtkPrintFanoutProfileVec( Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    int i;
    printf( "Fanout profile (%d):\n", Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
    {
        printf( "%3d : time = %7.2f ps   load = %7.2f ff  ", i, Bus_SclObjETime(pFanout), Bus_SclObjCin(pFanout) );
        if ( pObj->pNtk->vPhases )
            printf( "%s", (pObj && Abc_ObjFanoutNum(pObj) == Vec_PtrSize(vFanouts) && Abc_ObjFaninPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) )) ? "*" : " " );
        printf( "\n" );
    }
    printf( "\n" );
}